

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redbase.cc
# Opt level: O3

int main(int argc,char **argv)

{
  RC rc;
  ostream *poVar1;
  
  if (argc != 2) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar1 = std::operator<<(poVar1,*argv);
    std::operator<<(poVar1," dbname \n");
    exit(1);
  }
  rc = SM_Manager::OpenDb(&smm,argv[1]);
  if (rc == 0) {
    RBparse(&pfm,&smm,&qlm);
    rc = SM_Manager::CloseDb(&smm);
    if (rc == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bye.\n",5);
      return 0;
    }
  }
  PrintError(rc);
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
    char *dbname;
    RC rc;

    // Look for 2 arguments.  The first is always the name of the program
    // that was executed, and the second should be the name of the
    // database.
    if (argc != 2) {
        cerr << "Usage: " << argv[0] << " dbname \n";
        exit(1);
    }

    // Opens up the database folder    
    dbname = argv[1];
    if ((rc = smm.OpenDb(dbname))) {
        PrintError(rc);
        return (1);
    }
    

    RBparse(pfm, smm, qlm);

    // Closes the database folder
    if ((rc = smm.CloseDb())) {
        PrintError(rc);
        return (1);
    }
    

    cout << "Bye.\n";
}